

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

void __thiscall smf::MidiFile::clear_no_deallocate(MidiFile *this)

{
  pointer p_Var1;
  pointer ppMVar2;
  MidiEventList *pMVar3;
  long lVar4;
  
  ppMVar2 = (this->m_events).
            super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_events).
                              super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2) >> 3)) {
    lVar4 = 0;
    do {
      MidiEventList::detach(ppMVar2[lVar4]);
      pMVar3 = (this->m_events).
               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar4];
      if (pMVar3 != (MidiEventList *)0x0) {
        MidiEventList::~MidiEventList(pMVar3);
      }
      operator_delete(pMVar3);
      (this->m_events).
      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4] = (MidiEventList *)0x0;
      lVar4 = lVar4 + 1;
      ppMVar2 = (this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar4 < (int)((ulong)((long)(this->m_events).
                                         super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar2)
                          >> 3));
  }
  std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
            (&this->m_events,1);
  pMVar3 = (MidiEventList *)operator_new(0x18);
  MidiEventList::MidiEventList(pMVar3);
  *(this->m_events).super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
   _M_impl.super__Vector_impl_data._M_start = pMVar3;
  this->m_timemapvalid = false;
  p_Var1 = (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
      super__Vector_impl_data._M_finish != p_Var1) {
    (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>._M_impl.
    super__Vector_impl_data._M_finish = p_Var1;
  }
  return;
}

Assistant:

void MidiFile::clear_no_deallocate(void) {
	for (int i=0; i<getTrackCount(); i++) {
		m_events[i]->detach();
		delete m_events[i];
		m_events[i] = NULL;
	}
	m_events.resize(1);
	m_events[0] = new MidiEventList;
	m_timemapvalid=0;
	m_timemap.clear();
	// m_events.resize(0);   // causes a memory leak [20150205 Jorden Thatcher]
}